

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_del.c
# Opt level: O1

int mpt_path_invalidate(mpt_path *path)

{
  int iVar1;
  uint32_t uVar2;
  char *pcVar3;
  ulong len;
  mpt_array arr;
  mpt_array local_18;
  
  pcVar3 = path->base;
  len = path->len + path->off;
  if (pcVar3 == (char *)0x0) {
    iVar1 = (uint)(len == 0) * 2 + -2;
  }
  else {
    iVar1 = 0;
    if ((path->flags & 0x40) != 0) {
      local_18._buf = (mpt_buffer *)(pcVar3 + -0x20);
      iVar1 = -2;
      if (len <= *(ulong *)(pcVar3 + -8)) {
        if (len == *(ulong *)(pcVar3 + -8)) {
          path->flags = path->flags & 0xfe;
          iVar1 = 0;
        }
        else {
          uVar2 = (*(local_18._buf)->_vptr->get_flags)(local_18._buf);
          if ((uVar2 & 0x101) == 0) {
            path->flags = path->flags & 0xfe;
            (local_18._buf)->_used = len;
            path->base[len] = '\0';
            iVar1 = 1;
          }
          else {
            pcVar3 = (char *)mpt_array_slice(&local_18,0,len);
            if (pcVar3 == (char *)0x0) {
              iVar1 = -1;
            }
            else {
              if (len < (local_18._buf)->_size) {
                pcVar3[len] = '\0';
              }
              (local_18._buf)->_used = len;
              path->base = pcVar3;
              path->flags = path->flags & 0xfe;
              iVar1 = 2;
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

extern int mpt_path_invalidate(MPT_STRUCT(path) *path)
{
	MPT_STRUCT(array) arr;
	size_t used, len = path->off + path->len;
	char *base;
	int flags;
	
	if (!(arr._buf = (void *) path->base)) {
		return len ? -2 : 0;
	}
	if (!(path->flags & MPT_PATHFLAG(HasArray))) {
		return 0;
	}
	used = (--arr._buf)->_used;
	
	if (len > used) {
		return MPT_ERROR(BadValue);
	}
	if (len == used) {
		path->flags &= ~MPT_PATHFLAG(KeepPost);
		return 0;
	}
	/* can modify local copy */
	flags = arr._buf->_vptr->get_flags(arr._buf);
	if (!(MPT_ENUM(BufferShared) & flags)
	 && !(MPT_ENUM(BufferImmutable) & flags)) {
		path->flags &= ~MPT_PATHFLAG(KeepPost);
		arr._buf->_used = len;
		((char *) path->base)[len] = 0;
		return 1;
	}
	/* create local buffer copy */
	if (!(base = mpt_array_slice(&arr, 0, len))) {
		return -1;
	}
	if (arr._buf->_size > len) {
		base[len] = '\0';
	}
	arr._buf->_used = len;
	path->base = base;
	path->flags &= ~MPT_PATHFLAG(KeepPost);
	return 2;
}